

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subset_iterator.hpp
# Opt level: O0

void __thiscall
burst::
subset_iterator<boost::range_detail::integer_iterator<int>,_std::less<void>,_std::vector<boost::range_detail::integer_iterator<int>,_std::allocator<boost::range_detail::integer_iterator<int>_>_>_>
::subset_iterator(subset_iterator<boost::range_detail::integer_iterator<int>,_std::less<void>,_std::vector<boost::range_detail::integer_iterator<int>,_std::allocator<boost::range_detail::integer_iterator<int>_>_>_>
                  *this,value_type first,value_type last)

{
  bool bVar1;
  size_type __n;
  allocator<boost::range_detail::integer_iterator<int>_> local_29;
  value_type local_28;
  value_type local_24;
  subset_iterator<boost::range_detail::integer_iterator<int>,_std::less<void>,_std::vector<boost::range_detail::integer_iterator<int>,_std::allocator<boost::range_detail::integer_iterator<int>_>_>_>
  *local_20;
  subset_iterator<boost::range_detail::integer_iterator<int>,_std::less<void>,_std::vector<boost::range_detail::integer_iterator<int>,_std::allocator<boost::range_detail::integer_iterator<int>_>_>_>
  *this_local;
  value_type local_10;
  value_type local_c;
  integer_iterator<int> last_local;
  integer_iterator<int> first_local;
  
  (this->m_begin).m_value = first;
  (this->m_end).m_value = last;
  local_24 = (this->m_begin).m_value;
  local_28 = (this->m_end).m_value;
  local_20 = this;
  local_10 = last;
  local_c = first;
  __n = std::distance<boost::range_detail::integer_iterator<int>>
                  ((integer_iterator<int>)local_24,(integer_iterator<int>)local_28);
  std::allocator<boost::range_detail::integer_iterator<int>_>::allocator(&local_29);
  std::
  vector<boost::range_detail::integer_iterator<int>,_std::allocator<boost::range_detail::integer_iterator<int>_>_>
  ::vector(&this->m_subset,__n,&local_29);
  std::allocator<boost::range_detail::integer_iterator<int>_>::~allocator(&local_29);
  this->m_subset_size = 0;
  bVar1 = std::is_sorted<boost::range_detail::integer_iterator<int>,std::less<void>>
                    ((this->m_begin).m_value,(this->m_end).m_value);
  if (!bVar1) {
    __assert_fail("std::is_sorted(m_begin, m_end, m_compare)",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/subset_iterator.hpp"
                  ,0x5d,
                  "burst::subset_iterator<boost::range_detail::integer_iterator<int>>::subset_iterator(ForwardIterator, ForwardIterator, compare_type) [ForwardIterator = boost::range_detail::integer_iterator<int>, Compare = std::less<void>, SubsetContainer = std::vector<boost::range_detail::integer_iterator<int>>]"
                 );
  }
  increment(this);
  return;
}

Assistant:

explicit subset_iterator
            (
                ForwardIterator first, ForwardIterator last,
                compare_type compare = compare_type{}
            ):
            m_begin(std::move(first)),
            m_end(std::move(last)),
            m_subset(static_cast<std::size_t>(std::distance(m_begin, m_end))),
            m_subset_size(0),
            m_compare(compare)
        {
            BOOST_ASSERT(std::is_sorted(m_begin, m_end, m_compare));
            increment();
        }